

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

void Assimp::IFC::Quadrify(ContourVector *contours,TempMesh *curmesh)

{
  pointer pPVar1;
  pointer pPVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pair<aiVector2t<double>,_aiVector2t<double>_> *ppVar6;
  pair<aiVector2t<double>,_aiVector2t<double>_> *__args;
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  bbs;
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pair<aiVector2t<double>,_aiVector2t<double>_> *)0x0;
  local_38.
  super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pair<aiVector2t<double>,_aiVector2t<double>_> *)0x0;
  std::
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  ::reserve(&local_38,
            ((long)(contours->
                   super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(contours->
                   super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  pPVar1 = (contours->
           super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (contours->
           super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar1 != pPVar2) {
    __args = &pPVar1->bb;
    do {
      if (local_38.
          super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_38.
          super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<aiVector2t<double>,aiVector2t<double>>,std::allocator<std::pair<aiVector2t<double>,aiVector2t<double>>>>
        ::_M_realloc_insert<std::pair<aiVector2t<double>,aiVector2t<double>>const&>
                  ((vector<std::pair<aiVector2t<double>,aiVector2t<double>>,std::allocator<std::pair<aiVector2t<double>,aiVector2t<double>>>>
                    *)&local_38,
                   (iterator)
                   local_38.
                   super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        dVar3 = (__args->first).x;
        dVar4 = (__args->first).y;
        dVar5 = (__args->second).y;
        ((local_38.
          super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->second).x = (__args->second).x;
        ((local_38.
          super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->second).y = dVar5;
        ((local_38.
          super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->first).x = dVar3;
        ((local_38.
          super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->first).y = dVar4;
        local_38.
        super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_38.
             super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      ppVar6 = __args + 2;
      __args = (pair<aiVector2t<double>,_aiVector2t<double>_> *)&__args[3].first.y;
    } while ((pointer)&ppVar6->second != pPVar2);
  }
  Quadrify(&local_38,curmesh);
  if (local_38.
      super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Quadrify(const ContourVector& contours, TempMesh& curmesh)
{
    std::vector<BoundingBox> bbs;
    bbs.reserve(contours.size());

    for(const ContourVector::value_type& val : contours) {
        bbs.push_back(val.bb);
    }

    Quadrify(bbs, curmesh);
}